

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

void reset_entrance_data(chunk *c)

{
  wchar_t wVar1;
  int **ppiVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  if (z_info->level_room_max != 0) {
    memset(dun->ent_n,0,(ulong)z_info->level_room_max << 2);
  }
  if (dun->ent2room != (int **)0x0) {
    ppiVar2 = dun->ent2room;
    piVar3 = *ppiVar2;
    if (piVar3 != (int *)0x0) {
      lVar5 = 8;
      do {
        mem_free(piVar3);
        ppiVar2 = dun->ent2room;
        piVar3 = *(int **)((long)ppiVar2 + lVar5);
        lVar5 = lVar5 + 8;
      } while (piVar3 != (int *)0x0);
    }
    mem_free(ppiVar2);
  }
  ppiVar2 = (int **)mem_alloc((long)c->height * 8 + 8);
  dun->ent2room = ppiVar2;
  wVar1 = c->height;
  if (L'\0' < wVar1) {
    lVar5 = 0;
    do {
      piVar3 = (int *)mem_alloc((long)c->width << 2);
      dun->ent2room[lVar5] = piVar3;
      if (L'\0' < c->width) {
        piVar3 = dun->ent2room[lVar5];
        lVar4 = 0;
        do {
          piVar3[lVar4] = -1;
          lVar4 = lVar4 + 1;
        } while (lVar4 < c->width);
      }
      lVar5 = lVar5 + 1;
      wVar1 = c->height;
    } while (lVar5 < wVar1);
  }
  dun->ent2room[wVar1] = (int *)0x0;
  return;
}

Assistant:

static void reset_entrance_data(const struct chunk *c)
{
	int i;

	for (i = 0; i < z_info->level_room_max; ++i) {
		dun->ent_n[i] = 0;
	}
	if (dun->ent2room) {
		for (i = 0; dun->ent2room[i]; ++i) {
			mem_free(dun->ent2room[i]);
		}
		mem_free(dun->ent2room);
	}
	/* Add a trailing NULL so the deallocation knows when to stop. */
	dun->ent2room = mem_alloc((c->height + 1) * sizeof(*dun->ent2room));
	for (i = 0; i < c->height; ++i) {
		int j;

		dun->ent2room[i] =
			mem_alloc(c->width * sizeof(*dun->ent2room[i]));
		for (j = 0; j < c->width; ++j) {
			dun->ent2room[i][j] = -1;
		}
	}
	dun->ent2room[c->height] = NULL;
}